

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O0

char * int2str::impl::detail<10000ull>::convert_step<char*>(number_t x,char *iter)

{
  unsigned_long_long w;
  char *iter_local;
  number_t x_local;
  
  if (x < 10000) {
    *iter = '0';
    x_local = (number_t)detail<1000ull>::convert_step<char*>(x,iter + 1);
  }
  else {
    *iter = (char)(x / 10000) + '0';
    x_local = (number_t)detail<1000ull>::convert_step<char*>(x % 10000,iter + 1);
  }
  return (char *)x_local;
}

Assistant:

inline static Iter convert_step(number_t x, Iter iter)
    {
        if (N > x)
        {
            *iter++ = '0';
            return detail<N / 10u>::convert_step(x, iter);
        }
        auto const w = x / N;
        *iter++ = static_cast<char>('0' + w);
        return detail<N / 10u>::convert_step(x - w * N, iter);
    }